

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRBitMatrixParser.cpp
# Opt level: O2

ByteArray *
ZXing::QRCode::ReadCodewords
          (ByteArray *__return_storage_ptr__,BitMatrix *bitMatrix,Version *version,
          FormatInformation *formatInfo)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  BitMatrix *pBVar7;
  pointer puVar8;
  int iVar9;
  int b;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  int b_1;
  uint uVar14;
  int iVar15;
  byte bVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  byte local_dd;
  uint local_dc;
  uint local_d8;
  uint local_d4;
  int x;
  undefined4 uStack_cc;
  uint8_t currentByte;
  undefined7 uStack_c7;
  pointer puStack_c0;
  pointer local_b8;
  pointer local_b0;
  BitMatrix *local_a8;
  BitMatrix *local_a0;
  ulong local_98;
  ulong local_90;
  BitMatrix functionPattern;
  int local_60;
  
  local_a8 = (BitMatrix *)__return_storage_ptr__;
  local_a0 = bitMatrix;
  switch(version->_type) {
  case Model1:
    functionPattern._width = 0;
    functionPattern._height = 0;
    functionPattern._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    functionPattern._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&functionPattern,
               (long)version->_totalCodewords);
    iVar19 = local_a0->_height;
    uVar11 = iVar19 / 4 + 3;
    iVar15 = (int)((long)iVar19 / 2);
    uVar6 = (iVar19 + -0x10) / 4;
    uVar10 = (long)(iVar19 + -8) / 4;
    uVar13 = 0;
    uVar12 = (long)iVar19 / 2 & 0xffffffff;
    if (iVar15 < 1) {
      uVar12 = uVar13;
    }
    iVar18 = (int)uVar10;
    if ((int)uVar6 < 1) {
      uVar6 = 0;
    }
    local_dc = iVar19 - 1;
    local_90 = uVar10 & 0xffffffff;
    if (iVar18 < 1) {
      local_90 = uVar13;
    }
    uVar3 = 0;
    if (0 < (int)uVar11) {
      uVar3 = uVar11;
    }
    local_d8 = iVar19 + 3;
    local_d4 = iVar19 - 9;
    while( true ) {
      uVar5 = (uint)uVar13;
      if (uVar5 == uVar3) break;
      local_98 = uVar13;
      if (uVar5 < 2) {
        _x = (FormatInformation *)CONCAT44(uStack_cc,uVar5 * 2);
        puVar8 = (pointer)0x0;
        while( true ) {
          iVar9 = (int)uVar13;
          iVar4 = (int)puVar8;
          if (iVar4 == (int)local_90) break;
          if ((((iVar9 != 0) || (iVar4 == 0)) || (((ulong)puVar8 & 1) != 0)) ||
             (iVar18 + -1 <= iVar4)) {
            _currentByte = (pointer)((ulong)_currentByte & 0xffffffffffffff00);
            uVar10 = 0;
            local_b0 = puVar8;
            while (uVar5 = (uint)uVar10, uVar5 != 8) {
              iVar17 = local_dc - (uVar5 & 1 | x);
              iVar9 = local_dc - ((int)(uVar10 >> 1) + iVar4 * 4);
              bVar1 = GetDataMaskBit((uint)formatInfo->dataMask,iVar17,iVar9,false);
              bVar2 = getBit(local_a0,iVar17,iVar9,formatInfo->isMirrored);
              _currentByte = (pointer)CONCAT71(uStack_c7,currentByte * '\x02' | bVar1 != bVar2);
              uVar10 = (ulong)(uVar5 + 1);
            }
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&functionPattern,
                       &currentByte);
            puVar8 = local_b0;
            uVar13 = local_98;
          }
          puVar8 = (pointer)(ulong)((int)puVar8 + 1);
        }
      }
      else {
        iVar4 = uVar11 - uVar5;
        if (iVar4 < 5) {
          _x = (FormatInformation *)CONCAT44(uStack_cc,(uint)(iVar4 == 4) + iVar4 * 2 + -1);
          uVar5 = 0;
          while( true ) {
            iVar9 = (int)local_98;
            if (uVar5 == uVar6) break;
            _currentByte = (pointer)((ulong)_currentByte & 0xffffffffffffff00);
            uVar10 = 0;
            local_b0 = (pointer)(ulong)uVar5;
            while (uVar14 = (uint)uVar10, uVar14 != 8) {
              iVar9 = x - (uVar14 & 1);
              iVar4 = local_d4 - ((int)(uVar10 >> 1) + uVar5 * 4);
              bVar1 = GetDataMaskBit((uint)formatInfo->dataMask,iVar9,iVar4,false);
              bVar2 = getBit(local_a0,iVar9,iVar4,formatInfo->isMirrored);
              _currentByte = (pointer)CONCAT71(uStack_c7,currentByte * '\x02' | bVar1 != bVar2);
              uVar10 = (ulong)(uVar14 + 1);
            }
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&functionPattern,
                       &currentByte);
            uVar5 = (int)local_b0 + 1;
          }
        }
        else {
          _x = (FormatInformation *)CONCAT44(uStack_cc,uVar5 * 4);
          puVar8 = (pointer)0x0;
          while( true ) {
            iVar9 = (int)uVar13;
            local_60 = (int)uVar12;
            iVar4 = (int)puVar8;
            if (iVar4 == local_60) break;
            if ((iVar4 < iVar15 + -4 || iVar9 != 2) &&
               (((uVar13 & 1) == 0 || iVar9 == iVar19 / 4 + -2) || iVar4 != 0)) {
              _currentByte = (pointer)((ulong)_currentByte & 0xffffffffffffff00);
              uVar10 = 0;
              local_b0 = puVar8;
              while (uVar5 = (uint)uVar10, uVar5 != 8) {
                iVar9 = local_d8 - (uVar5 & 3 | x);
                iVar17 = ((~(iVar4 * 2) + iVar19) - (uint)(iVar15 + -3 <= iVar4)) -
                         (int)(uVar10 >> 2);
                bVar1 = GetDataMaskBit((uint)formatInfo->dataMask,iVar9,iVar17,false);
                bVar2 = getBit(local_a0,iVar9,iVar17,formatInfo->isMirrored);
                _currentByte = (pointer)CONCAT71(uStack_c7,currentByte * '\x02' | bVar1 != bVar2);
                uVar10 = (ulong)(uVar5 + 1);
              }
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&functionPattern,
                         &currentByte);
              puVar8 = local_b0;
              uVar13 = local_98;
            }
            puVar8 = (pointer)(ulong)((int)puVar8 + 1);
          }
        }
      }
      uVar13 = (ulong)(iVar9 + 1);
    }
    *(byte *)functionPattern._0_8_ = *(byte *)functionPattern._0_8_ & 0xf;
    pBVar7 = local_a8;
    if (version->_totalCodewords ==
        (int)functionPattern._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_start - functionPattern._width) {
      local_a8->_width = functionPattern._width;
      local_a8->_height = functionPattern._height;
      (local_a8->_bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           functionPattern._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (local_a8->_bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish =
           functionPattern._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      pBVar7 = &functionPattern;
    }
    pBVar7->_width = 0;
    pBVar7->_height = 0;
    (pBVar7->_bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pBVar7->_bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    pBVar7 = &functionPattern;
    goto LAB_0018d8d9;
  case Model2:
    _x = formatInfo;
    Version::buildFunctionPattern(&functionPattern,version);
    _currentByte = (pointer)0x0;
    puStack_c0 = (pointer)0x0;
    local_b8 = (pointer)0x0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&currentByte,
               (long)version->_totalCodewords);
    uVar6 = local_a0->_height;
    iVar19 = uVar6 - 1;
    puVar8 = (pointer)0x0;
    local_b0 = (pointer)(ulong)uVar6;
    if ((int)uVar6 < 1) {
      local_b0 = puVar8;
    }
    local_d8 = CONCAT31(local_d8._1_3_,1);
    local_dc = 0;
    local_98 = CONCAT44(local_98._4_4_,iVar19);
    for (; 0 < iVar19; iVar19 = iVar19 + -2) {
      if (iVar19 == 6) {
        iVar19 = 5;
      }
      uVar6 = 0;
      while (uVar6 != (uint)local_b0) {
        uVar11 = (int)local_98 - uVar6;
        if ((local_d8 & 1) == 0) {
          uVar11 = uVar6;
        }
        local_d4 = uVar6;
        for (iVar15 = 0; iVar15 != -2; iVar15 = iVar15 + -1) {
          iVar18 = iVar19 + iVar15;
          bVar1 = BitMatrix::get(&functionPattern,iVar18,uVar11);
          if (!bVar1) {
            bVar1 = GetDataMaskBit((uint)_x->dataMask,iVar18,uVar11,false);
            bVar2 = getBit(local_a0,iVar18,uVar11,_x->isMirrored);
            bVar16 = (char)puVar8 * '\x02' | bVar1 != bVar2;
            puVar8 = (pointer)(ulong)bVar16;
            local_dc = local_dc + 1;
            if ((local_dc & 7) == 0) {
              local_dd = bVar16;
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
              emplace_back<unsigned_char>
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&currentByte,
                         &local_dd);
              puVar8 = (pointer)0x0;
            }
          }
        }
        uVar6 = local_d4 + 1;
      }
      local_d8 = local_d8 ^ 1;
    }
    break;
  case Micro:
    Version::buildFunctionPattern(&functionPattern,version);
    local_d4 = version->_versionNumber;
    bVar1 = formatInfo->ecLevel == Low;
    local_d8 = bVar1 + 8 + (uint)bVar1;
    if (local_d4 == 1) {
      local_d8 = 2;
    }
    _currentByte = (pointer)0x0;
    puStack_c0 = (pointer)0x0;
    local_b8 = (pointer)0x0;
    _x = formatInfo;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&currentByte,
               (long)version->_totalCodewords);
    local_d4 = local_d4 & 0x80000001;
    uVar6 = local_a0->_height;
    local_dc = 0;
    local_98 = (ulong)uVar6;
    if ((int)uVar6 < 1) {
      local_98 = 0;
    }
    local_90 = CONCAT71(local_90._1_7_,1);
    iVar19 = 0;
    for (iVar15 = uVar6 - 1; 0 < iVar15; iVar15 = iVar15 + -2) {
      iVar18 = 0;
      while (iVar18 != (int)local_98) {
        local_b0 = (pointer)CONCAT44(local_b0._4_4_,iVar18);
        iVar4 = (uVar6 - 1) - iVar18;
        if ((local_90 & 1) == 0) {
          iVar4 = iVar18;
        }
        for (iVar18 = 0; iVar18 != -2; iVar18 = iVar18 + -1) {
          iVar9 = iVar15 + iVar18;
          bVar1 = BitMatrix::get(&functionPattern,iVar9,iVar4);
          if (!bVar1) {
            bVar1 = GetDataMaskBit((uint)_x->dataMask,iVar9,iVar4,true);
            bVar2 = getBit(local_a0,iVar9,iVar4,_x->isMirrored);
            bVar16 = (char)local_dc * '\x02' | bVar1 != bVar2;
            uVar11 = CONCAT31((int3)(local_dc >> 8),bVar16);
            if (iVar19 == 7) {
LAB_0018d571:
              local_dd = bVar16;
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
              emplace_back<unsigned_char>
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&currentByte,
                         &local_dd);
              local_dc = 0;
              iVar19 = 0;
            }
            else {
              local_dc = uVar11;
              if (iVar19 == 3) {
                if (local_d4 == 1) {
                  if (local_d8 == (int)puStack_c0 - _currentByte) goto LAB_0018d571;
                }
                iVar19 = 4;
              }
              else {
                iVar19 = iVar19 + 1;
              }
            }
          }
        }
        iVar18 = (uint)local_b0 + 1;
      }
      local_90 = local_90 ^ 1;
    }
    break;
  case rMQR:
    _x = formatInfo;
    Version::buildFunctionPattern(&functionPattern,version);
    _currentByte = (pointer)0x0;
    puStack_c0 = (pointer)0x0;
    local_b8 = (pointer)0x0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&currentByte,
               (long)version->_totalCodewords);
    iVar19 = local_a0->_height;
    bVar16 = 0;
    local_98 = CONCAT44(local_98._4_4_,iVar19);
    iVar15 = 0;
    if (0 < iVar19) {
      iVar15 = iVar19;
    }
    local_b0 = (pointer)CONCAT44(local_b0._4_4_,iVar15);
    local_d8 = CONCAT31(local_d8._1_3_,1);
    local_dc = 0;
    iVar19 = local_a0->_width;
    while (2 < iVar19) {
      local_90 = CONCAT44(local_90._4_4_,iVar19 + -2);
      uVar6 = 0;
      while (uVar6 != (uint)local_b0) {
        uVar11 = ~uVar6 + (int)local_98;
        if ((local_d8 & 1) == 0) {
          uVar11 = uVar6;
        }
        local_d4 = uVar6;
        for (iVar15 = -2; iVar15 != -4; iVar15 = iVar15 + -1) {
          iVar18 = iVar19 + iVar15;
          bVar1 = BitMatrix::get(&functionPattern,iVar18,uVar11);
          if (!bVar1) {
            bVar1 = GetDataMaskBit((uint)_x->dataMask,iVar18,uVar11,false);
            bVar2 = getBit(local_a0,iVar18,uVar11,_x->isMirrored);
            bVar16 = bVar16 * '\x02' | bVar1 != bVar2;
            local_dc = local_dc + 1;
            if ((local_dc & 7) == 0) {
              local_dd = bVar16;
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
              emplace_back<unsigned_char>
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&currentByte,
                         &local_dd);
              bVar16 = 0;
            }
          }
        }
        uVar6 = local_d4 + 1;
      }
      local_d8 = local_d8 ^ 1;
      iVar19 = (int)local_90;
    }
    break;
  default:
    (__return_storage_ptr__->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    return __return_storage_ptr__;
  }
  pBVar7 = local_a8;
  if (version->_totalCodewords == (int)puStack_c0 - (int)_currentByte) {
    *(pointer *)local_a8 = _currentByte;
    (local_a8->_bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = puStack_c0;
    (local_a8->_bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = local_b8;
    pBVar7 = (BitMatrix *)&currentByte;
  }
  pBVar7->_width = 0;
  pBVar7->_height = 0;
  (pBVar7->_bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pBVar7->_bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&currentByte);
  pBVar7 = (BitMatrix *)&functionPattern._bits;
LAB_0018d8d9:
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)pBVar7);
  return (ByteArray *)local_a8;
}

Assistant:

ByteArray ReadCodewords(const BitMatrix& bitMatrix, const Version& version, const FormatInformation& formatInfo)
{
	switch (version.type()) {
	case Type::Micro: return ReadMQRCodewords(bitMatrix, version, formatInfo);
	case Type::rMQR: return ReadRMQRCodewords(bitMatrix, version, formatInfo);
	case Type::Model1: return ReadQRCodewordsModel1(bitMatrix, version, formatInfo);
	case Type::Model2: return ReadQRCodewords(bitMatrix, version, formatInfo);
	}

	return {};
}